

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O2

int ffgcvn(fitsfile *fptr,int ncols,int *datatype,int *colnum,LONGLONG firstrow,LONGLONG nrows,
          void **nulval,void **array,int *anynul,int *status)

{
  long *__ptr;
  long lVar1;
  LONGLONG firstrow_00;
  ulong uVar2;
  long lVar3;
  int *anynul_00;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int typecode;
  LONGLONG local_8c0;
  ulong local_8b8;
  long nrowbuf;
  LONGLONG width;
  LONGLONG ntotrows;
  LONGLONG repeat;
  size_t sizes [255];
  
  uVar2 = (ulong)(uint)ncols;
  local_8c0 = firstrow;
  memset(sizes,0,0x7f8);
  sizes[0xe] = 1;
  sizes[0xc] = 1;
  sizes[0xb] = 1;
  sizes[0x15] = 2;
  sizes[0x14] = 2;
  sizes[0x1e] = 4;
  sizes[0x1f] = 4;
  sizes[0x28] = 8;
  sizes[0x29] = 8;
  sizes[0x50] = 8;
  sizes[0x51] = 8;
  sizes[0x2a] = 4;
  sizes[0x52] = 8;
  sizes[0xa3] = 0x10;
  if (0 < *status) {
    return *status;
  }
  if (ncols < 1) {
    *status = 0;
    return 0;
  }
  local_8b8 = uVar2;
  __ptr = (long *)malloc(uVar2 * 8);
  if (__ptr == (long *)0x0) {
    *status = 0x71;
    return 0x71;
  }
  ffgnrwll(fptr,&ntotrows,status);
  ffgrsz(fptr,&nrowbuf,status);
  uVar4 = 1000;
  if ((uint)ncols < 1000) {
    uVar4 = uVar2;
  }
  uVar2 = 0;
  do {
    if (uVar4 == uVar2) {
      iVar6 = *status;
      if (iVar6 == 0) {
        if (ncols == 1) {
          ffgcv(fptr,*datatype,*colnum,local_8c0,1,nrows * *__ptr,*nulval,*array,anynul,status);
          free(__ptr);
          return *status;
        }
        local_8b8 = local_8b8 << 2;
        lVar5 = 0;
        firstrow_00 = local_8c0;
        goto LAB_00181cf5;
      }
      break;
    }
    ffgtclll(fptr,colnum[uVar2],&typecode,&repeat,&width,status);
    __ptr[uVar2] = repeat;
    iVar6 = datatype[uVar2];
    if ((((long)iVar6 == 1) || (iVar6 == 0x10)) || (sizes[iVar6] == 0)) {
      ffpmsg("Cannot read from TBIT or TSTRING datatypes (ffgcvn)");
      *status = 0x19a;
    }
    if (typecode < 0) {
      ffpmsg("Cannot read from variable-length data (ffgcvn)");
      *status = 0x140;
      iVar6 = 0x140;
      break;
    }
    iVar6 = *status;
    uVar2 = uVar2 + 1;
  } while (iVar6 == 0);
LAB_00181ccf:
  free(__ptr);
  return iVar6;
LAB_00181cf5:
  lVar1 = nrows - lVar5;
  if (lVar1 == 0 || nrows < lVar5) goto LAB_00181df5;
  lVar3 = nrowbuf;
  if (lVar1 < nrowbuf) {
    lVar3 = lVar1;
  }
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (local_8b8 == uVar4) goto LAB_00181de5;
    lVar1 = *(long *)((long)__ptr + uVar4 * 2);
    anynul_00 = (int *)((long)anynul + uVar4);
    if (anynul == (int *)0x0) {
      anynul_00 = (int *)0x0;
    }
    ffgcv(fptr,*(int *)((long)datatype + uVar4),*(int *)((long)colnum + uVar4),firstrow_00,1,
          lVar1 * lVar3,*(void **)((long)nulval + uVar4 * 2),
          (void *)(lVar1 * lVar5 * sizes[*(int *)((long)datatype + uVar4)] +
                  *(long *)((long)array + uVar4 * 2)),anynul_00,status);
    uVar2 = uVar4 + 4;
  } while (*status == 0);
  sprintf((char *)&repeat,"Failed to read column %d data rows %lld-%lld (ffgcvn)",
          (ulong)*(uint *)((long)colnum + uVar4),firstrow_00,lVar3 + -1 + firstrow_00);
  ffpmsg((char *)&repeat);
  iVar6 = *status;
  if (iVar6 != 0) goto LAB_00181ccf;
LAB_00181de5:
  lVar5 = lVar5 + lVar3;
  firstrow_00 = firstrow_00 + lVar3;
  goto LAB_00181cf5;
LAB_00181df5:
  iVar6 = 0;
  goto LAB_00181ccf;
}

Assistant:

int ffgcvn( fitsfile *fptr,   /* I - FITS file pointer                       */
	    int ncols,        /* I - number of columns to read               */
            int  *datatype,   /* I - datatypes of the values                 */
            int  *colnum,     /* I - columns numbers to read (1 = 1st col)   */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)     */
            LONGLONG nrows,       /* I - number of rows to read              */
            void **nulval,    /* I - array of pointers to values for undefined pixels */
            void **array,     /* O - array of pointers to values that are returned    */
            int  *anynul,     /* O - anynul[i] set to 1 if any values in column i are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read arrays of values from NCOLS table columns. This is an optimization
  to read all columns in one pass through the table.  The datatypes of the
  input arrays are defined by the 3rd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements for column i will be set equal to *(nulval[i]), unless nulval[i]=0
  in which case no checking for undefined values will be performed.
  anynul[i] is returned with a value of true if any pixels in column i are undefined.
*/
{
    LONGLONG ntotrows, ndone, nread, currow;
    long nrowbuf;
    LONGLONG *repeats = 0;
    size_t sizes[255] = {0};
    int icol;

    sizes[TBYTE] = sizes[TSBYTE] = sizes[TLOGICAL] = sizeof(char);
    sizes[TUSHORT] = sizes[TSHORT] = sizeof(short int);
    sizes[TINT] = sizes[TUINT] = sizeof(int);
    sizes[TLONG] = sizes[TULONG] = sizeof(long int);
    sizes[TLONGLONG] = sizes[TULONGLONG] = sizeof(LONGLONG);
    sizes[TFLOAT] = sizeof(float);
    sizes[TDOUBLE] = sizeof(double);
    sizes[TDBLCOMPLEX] = 2*sizeof(double);

    if (*status > 0)
        return(*status);

    if (ncols <= 0) return (*status=0);

    repeats = malloc(sizeof(LONGLONG)*ncols);
    if (repeats == 0) return (*status=MEMORY_ALLOCATION);

    fits_get_num_rowsll(fptr, &ntotrows, status);
    fits_get_rowsize(fptr, &nrowbuf, status);

    /* Retrieve column repeats */
    for (icol = 0; (icol < ncols) && (icol < 1000); icol++) {
      int typecode;
      LONGLONG repeat, width;
      fits_get_coltypell(fptr, colnum[icol], &typecode, 
			 &repeat, &width, status);
      repeats[icol] = repeat;

      if (datatype[icol] == TBIT || datatype[icol] == TSTRING ||
	  sizes[datatype[icol]] == 0) {
	ffpmsg("Cannot read from TBIT or TSTRING datatypes (ffgcvn)");
	*status = BAD_DATATYPE;
      }
      if (typecode < 0) {
	ffpmsg("Cannot read from variable-length data (ffgcvn)");
	*status = BAD_DIMEN;
      }

      if (*status) break;
    }
    if (*status) {
      free(repeats);
      return *status;
    }

    /* Optimize for 1 column */
    if (ncols == 1) {
      fits_read_col(fptr, datatype[0], colnum[0], firstrow, 1,
		    nrows*repeats[0], nulval[0], 
		    array[0], anynul ? &(anynul[0]) : 0, status);
      free(repeats);
      return *status;
    }

    /* Scan through file, in chunks of nrowbuf */
    currow = firstrow;
    ndone = 0;
    while (ndone < nrows) {
      int icol;
      nread = (nrows-ndone);  /* Number of rows to read (not elements) */
      if (nread > nrowbuf) nread = nrowbuf;

      for (icol=0; icol<ncols; icol++) {
	LONGLONG nelem1 = (nread*repeats[icol]);
	char *array1 = (char *) array[icol] + repeats[icol]*ndone*sizes[datatype[icol]];

	fits_read_col(fptr, datatype[icol], colnum[icol], currow, 1, 
		      nelem1, nulval[icol], array1, 
		      (anynul ? &(anynul[icol]) : 0), status);
	if (*status) {
	  char errmsg[100];
	  sprintf(errmsg, 
		  "Failed to read column %d data rows %lld-%lld (ffgcvn)",
		  colnum[icol], currow, currow+nread-1);
	  ffpmsg(errmsg);
	  break;
	}
      }

      if (*status) break;
      currow += nread;
      ndone += nread;
    }

    free(repeats);
    return *status;
}